

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::GetOrCreateValue(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                   *this)

{
  int iVar1;
  ValueHolder *this_00;
  pointer pVVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pthread_key_t *in_RDI;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  ThreadLocalValueHolderBase *in_stack_ffffffffffffffc0;
  GTestLog local_30;
  int local_2c;
  ValueHolder *local_28;
  ValueHolder *local_20;
  void *local_18;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *local_8;
  
  local_18 = pthread_getspecific(*in_RDI);
  if (local_18 == (void *)0x0) {
    pVVar2 = std::
             unique_ptr<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
             ::operator->((unique_ptr<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
                           *)0x194431);
    iVar1 = (*pVVar2->_vptr_ValueHolderFactory[2])();
    local_28 = (ValueHolder *)CONCAT44(extraout_var,iVar1);
    local_20 = local_28;
    local_2c = pthread_setspecific(*in_RDI,local_28);
    if (local_2c != 0) {
      GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
      poVar3 = GTestLog::GetStream(&local_30);
      poVar3 = std::operator<<(poVar3,"pthread_setspecific(key_, holder_base)");
      poVar3 = std::operator<<(poVar3,"failed with error ");
      std::ostream::operator<<(poVar3,local_2c);
      GTestLog::~GTestLog((GTestLog *)poVar3);
    }
    local_8 = ValueHolder::pointer(local_20);
  }
  else {
    this_00 = CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                        (in_stack_ffffffffffffffc0);
    local_8 = ValueHolder::pointer(this_00);
  }
  return local_8;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != nullptr) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = default_factory_->MakeNewHolder();
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }